

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O2

FILE * libxml_PyFileGet(PyObject *f)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  FILE *pFVar4;
  char *__modes;
  bool bVar5;
  
  iVar1 = PyObject_AsFileDescriptor();
  uVar2 = fcntl64(iVar1,3,0);
  switch(uVar2 & 3) {
  case 0:
    bVar5 = (uVar2 >> 10 & 1) != 0;
    pcVar3 = "r";
    __modes = "r+";
    break;
  case 1:
    bVar5 = (uVar2 >> 10 & 1) != 0;
    pcVar3 = "w";
    __modes = "a";
    break;
  case 2:
    bVar5 = (uVar2 >> 10 & 1) != 0;
    pcVar3 = "rw";
    __modes = "a+";
    break;
  case 3:
    goto switchD_0013ee93_caseD_3;
  }
  if (!bVar5) {
    __modes = pcVar3;
  }
  iVar1 = dup(iVar1);
  if (iVar1 != -1) {
    pFVar4 = fdopen(iVar1,__modes);
    if (pFVar4 != (FILE *)0x0) {
      return (FILE *)pFVar4;
    }
    close(iVar1);
  }
switchD_0013ee93_caseD_3:
  return (FILE *)0x0;
}

Assistant:

FILE *
libxml_PyFileGet(PyObject *f) {
    int fd, flags;
    FILE *res;
    const char *mode;

    fd = PyObject_AsFileDescriptor(f);
    /*
     * Get the flags on the fd to understand how it was opened
     */
    flags = fcntl(fd, F_GETFL, 0);
    switch (flags & O_ACCMODE) {
        case O_RDWR:
	    if (flags & O_APPEND)
	        mode = "a+";
	    else
	        mode = "rw";
	    break;
        case O_RDONLY:
	    if (flags & O_APPEND)
	        mode = "r+";
	    else
	        mode = "r";
	    break;
	case O_WRONLY:
	    if (flags & O_APPEND)
	        mode = "a";
	    else
	        mode = "w";
	    break;
	default:
	    return(NULL);
    }

    /*
     * the FILE struct gets a new fd, so that it can be closed
     * independently of the file descriptor given. The risk though is
     * lack of sync. So at the python level sync must be implemented
     * before and after a conversion took place. No way around it
     * in the Python3 infrastructure !
     * The duplicated fd and FILE * will be released in the subsequent
     * call to libxml_PyFileRelease() which must be generated accordingly
     */
    fd = dup(fd);
    if (fd == -1)
        return(NULL);
    res = fdopen(fd, mode);
    if (res == NULL) {
        close(fd);
	return(NULL);
    }
    return(res);
}